

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

TestResult * receive_result_info_nofork(char *tcname,char *tname,int iter,int duration)

{
  TestResult *pTVar1;
  char *pcVar2;
  
  pTVar1 = receive_test_result(0);
  if (pTVar1 != (TestResult *)0x0) {
    pTVar1->tcname = tcname;
    pTVar1->tname = tname;
    pTVar1->iter = iter;
    pTVar1->duration = duration;
    if (pTVar1->msg == (char *)0x0) {
      pTVar1->rtype = CK_PASS;
      pcVar2 = strdup("Passed");
      pTVar1->msg = pcVar2;
    }
    else {
      pTVar1->rtype = CK_FAILURE;
    }
    return pTVar1;
  }
  eprintf("Failed to receive test result",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
          ,0x1b8);
}

Assistant:

static TestResult *receive_result_info_nofork(const char *tcname,
                                              const char *tname,
                                              int iter, int duration)
{
    TestResult *tr;

    tr = receive_test_result(0);
    if(tr == NULL)
    {
        eprintf("Failed to receive test result", __FILE__, __LINE__);
    }
    else
    {
        tr->tcname = tcname;
        tr->tname = tname;
        tr->iter = iter;
        tr->duration = duration;
        set_nofork_info(tr);
    }

    return tr;
}